

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O2

void __thiscall tcmalloc::ThreadCache::~ThreadCache(ThreadCache *this)

{
  uint32_t N;
  ulong uVar1;
  ThreadCache *src;
  
  src = this;
  for (uVar1 = 0; uVar1 < DAT_00125d90; uVar1 = uVar1 + 1) {
    N = src->list_[0].length_;
    if (N != 0) {
      ReleaseToCentralCache(this,src->list_,(uint32_t)uVar1,N);
    }
    src = (ThreadCache *)(src->list_ + 1);
  }
  return;
}

Assistant:

ThreadCache::~ThreadCache() {
  // Put unused memory back into central cache
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    if (list_[cl].length() > 0) {
      ReleaseToCentralCache(&list_[cl], cl, list_[cl].length());
    }
  }
}